

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O2

void If_Dec08Verify(word *pF,int nVars,uint *pZ)

{
  word *pwVar1;
  word *pwVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  word (*pawVar7) [16];
  uint uVar8;
  word (*pawVar9) [16];
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  word *pG [4];
  ulong auStack_8b8 [16];
  word pN [16] [16];
  
  uVar8 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar8) {
    uVar3 = (ulong)uVar8;
  }
  uVar5 = 0;
  if (0 < nVars) {
    uVar5 = (ulong)(uint)nVars;
  }
  pawVar7 = Truth10;
  pawVar9 = pN;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
      (*pawVar9)[uVar12] = (*pawVar7)[uVar12];
    }
    pawVar7 = pawVar7 + 1;
    pawVar9 = pawVar9 + 1;
  }
  uVar4 = (ulong)uVar8;
  iVar6 = (int)uVar5 + -1;
  pawVar9 = pN + uVar5;
  lVar10 = 0;
  while( true ) {
    uVar8 = pZ[lVar10];
    if (uVar8 == 0) {
      uVar4 = 0;
      do {
        if (uVar3 == uVar4) {
          return;
        }
        pwVar2 = pN[iVar6] + uVar4;
        pwVar1 = pF + uVar4;
        uVar4 = uVar4 + 1;
      } while (*pwVar2 == *pwVar1);
      If_Dec08PrintConfig(pZ);
      Kit_DsdPrintFromTruth((uint *)pF,nVars);
      putchar(10);
      Kit_DsdPrintFromTruth((uint *)(pN + ((int)uVar5 + -1)),nVars);
      putchar(10);
      puts("Verification failed!");
      return;
    }
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 4) {
      *(ulong *)((long)pG + lVar13 * 2) =
           (long)pN[0] + (ulong)((uVar8 >> ((byte)lVar13 & 0x1f | 0x10) & 7) << 7);
    }
    if (10 < nVars) break;
    for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
      (*pawVar9)[uVar12] = 0;
    }
    for (uVar11 = 0; uVar11 != 0x10; uVar11 = uVar11 + 1) {
      if (((uVar8 & 0xffff) >> (uVar11 & 0x1f) & 1) != 0) {
        for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
          auStack_8b8[uVar12] = 0xffffffffffffffff;
        }
        for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
          pwVar2 = pG[lVar13];
          for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
            auStack_8b8[uVar12] =
                 auStack_8b8[uVar12] &
                 (pwVar2[uVar12] ^ (ulong)((uVar11 >> ((uint)lVar13 & 0x1f) & 1) != 0) - 1);
          }
        }
        for (uVar12 = 0; uVar4 != uVar12; uVar12 = uVar12 + 1) {
          (*pawVar9)[uVar12] = (*pawVar9)[uVar12] | auStack_8b8[uVar12];
        }
      }
    }
    lVar10 = lVar10 + 1;
    uVar5 = uVar5 + 1;
    iVar6 = iVar6 + 1;
    pawVar9 = pawVar9 + 1;
  }
  __assert_fail("nVars <= 10",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                ,0x6b,"void If_Dec08ComposeLut4(int, word **, word *, int)");
}

Assistant:

void If_Dec08Verify( word * pF, int nVars, unsigned * pZ )
{
    word pN[16][16], * pG[4];
    int i, w, v, k, nWords;
    unsigned z;
    nWords = If_Dec08WordNum( nVars );
    for ( k = 0; k < nVars; k++ )
        for ( w = 0; w < nWords; w++ )
            pN[k][w] = Truth10[k][w];
    for ( i = 0; (z = pZ[i]); i++, k++ )
    {
        for ( v = 0; v < 4; v++ )
            pG[v] = pN[ (z >> (16+(v<<2))) & 7 ];
        If_Dec08ComposeLut4( (int)(z & 0xffff), pG, pN[k], nVars );
    }
    k--;
    for ( w = 0; w < nWords; w++ )
        if ( pN[k][w] != pF[w] )
        {
            If_Dec08PrintConfig( pZ );
            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned*)pN[k], nVars ); printf( "\n" );
            printf( "Verification failed!\n" );
            break;
        }
}